

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

char * serial_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int fd;
  Serial *serial;
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  
  (*seat->vt->set_trust_status)(seat,false);
  serial = (Serial *)safemalloc(1,0x58,0);
  (serial->output_data).ic = (IdempotentCallback *)0x0;
  (serial->backend).vt = (BackendVtable *)0x0;
  serial->seat = (Seat *)0x0;
  serial->logctx = (LogContext *)0x0;
  serial->fd = 0;
  serial->finished = false;
  *(undefined3 *)&serial->field_0x15 = 0;
  serial->inbufsize = 0;
  (serial->output_data).head = (bufchain_granule *)0x0;
  (serial->output_data).tail = (bufchain_granule *)0x0;
  (serial->output_data).buffersize = 0;
  (serial->output_data).queue_idempotent_callback = (_func_void_IdempotentCallback_ptr *)0x0;
  (serial->backend).interactor = (Interactor *)0x0;
  (serial->backend).vt = vt;
  *backend_handle = &serial->backend;
  serial->seat = seat;
  serial->logctx = logctx;
  serial->finished = false;
  serial->inbufsize = 0;
  bufchain_init(&serial->output_data);
  pcVar1 = conf_get_str(conf,0x3e);
  logeventf(serial->logctx,"Opening serial device %s",pcVar1);
  fd = open(pcVar1,0x902);
  serial->fd = fd;
  if (-1 < fd) {
    cloexec(fd);
    pcVar2 = serial_configure(serial,conf);
    if (pcVar2 == (char *)0x0) {
      pcVar1 = dupstr(pcVar1);
      *realhost = pcVar1;
      if (serial_by_fd == (tree234 *)0x0) {
        serial_by_fd = newtree234(serial_compare_by_fd);
      }
      add234(serial_by_fd,serial);
      serial_uxsel_setup(serial);
      (*serial->seat->vt->update_specials_menu)(serial->seat);
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  piVar3 = __errno_location();
  pcVar2 = strerror(*piVar3);
  pcVar1 = dupprintf("Opening serial port \'%s\': %s",pcVar1,pcVar2);
  return pcVar1;
}

Assistant:

static char *serial_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    Serial *serial;
    char *err;
    char *line;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    serial = snew(Serial);
    memset(serial, 0, sizeof(Serial));
    serial->backend.vt = vt;
    *backend_handle = &serial->backend;

    serial->seat = seat;
    serial->logctx = logctx;
    serial->finished = false;
    serial->inbufsize = 0;
    bufchain_init(&serial->output_data);

    line = conf_get_str(conf, CONF_serline);
    logeventf(serial->logctx, "Opening serial device %s", line);

    serial->fd = open(line, O_RDWR | O_NOCTTY | O_NDELAY | O_NONBLOCK);
    if (serial->fd < 0)
        return dupprintf("Opening serial port '%s': %s",
                         line, strerror(errno));

    cloexec(serial->fd);

    err = serial_configure(serial, conf);
    if (err)
        return err;

    *realhost = dupstr(line);

    if (!serial_by_fd)
        serial_by_fd = newtree234(serial_compare_by_fd);
    add234(serial_by_fd, serial);

    serial_uxsel_setup(serial);

    /*
     * Specials are always available.
     */
    seat_update_specials_menu(serial->seat);

    return NULL;
}